

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

type * __thiscall
fmt::v5::sprintf<fmt::v5::basic_string_view<char>,int,int>
          (type *__return_storage_ptr__,v5 *this,basic_string_view<char> *format,int *args,
          int *args_1)

{
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_int>
  as;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28 [2];
  ulong local_18;
  
  local_28[0] = (ulong)*(uint *)&format->data_;
  local_18 = (ulong)(uint)*args;
  local_38 = *(undefined8 *)this;
  uStack_30 = *(undefined8 *)(this + 8);
  args_00.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)args_1;
  args_00.types_ = (unsigned_long_long)local_28;
  vsprintf<fmt::v5::basic_string_view<char>,char>
            (__return_storage_ptr__,(v5 *)&local_38,
             format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int,int>
             ::TYPES,args_00);
  return __return_storage_ptr__;
}

Assistant:

sprintf(const S &format, const Args & ... args) {
  internal::check_format_string<Args...>(format);
  typedef internal::basic_buffer<FMT_CHAR(S)> buffer;
  typedef typename basic_printf_context_t<buffer>::type context;
  format_arg_store<context, Args...> as{ args... };
  return vsprintf(to_string_view(format),
                  basic_format_args<context>(as));
}